

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O1

void __thiscall cp::PlanFootprints::calcNextFootprint(PlanFootprints *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  
  uVar14 = (ulong)*(uint *)(this + 0x2e0);
  dVar1 = *(double *)(this + 0x1f0);
  dVar2 = *(double *)(this + 0x1f8);
  dVar3 = *(double *)(this + uVar14 * 0x18 + 0x4e8);
  dVar4 = *(double *)(this + 0x200);
  dVar17 = dVar2 * dVar3 - *(double *)(this + uVar14 * 0x18 + 0x4e0) * dVar4;
  dVar8 = *(double *)(this + uVar14 * 0x18 + 0x4e0) * dVar1 -
          *(double *)(this + uVar14 * 0x18 + 0x4d8) * dVar2;
  dVar8 = dVar8 + dVar8;
  dVar5 = *(double *)(this + 0x208);
  dVar18 = dVar4 * *(double *)(this + uVar14 * 0x18 + 0x4d8) - dVar3 * dVar1;
  dVar17 = dVar17 + dVar17;
  dVar18 = dVar18 + dVar18;
  dVar9 = *(double *)(this + uVar14 * 0x18 + 0x4d8 + 8);
  dVar7 = *(double *)(this + 0x1d8);
  dVar6 = *(double *)(this + 0x1e0);
  dVar10 = *(double *)(this + 0x330);
  dVar11 = *(double *)(this + 0x338);
  dVar12 = *(double *)(this + 0x340);
  dVar13 = *(double *)(this + 0x348);
  dVar19 = dVar4 * dVar10 - dVar1 * dVar12;
  auVar20._8_4_ = SUB84(dVar19,0);
  auVar20._0_8_ = dVar4 * dVar11 - dVar1 * dVar13;
  auVar20._12_4_ = (int)((ulong)dVar19 >> 0x20);
  auVar20 = auVar20 ^ _DAT_0010a050;
  dVar19 = dVar1 * dVar10 + dVar4 * dVar12;
  auVar16._8_4_ = SUB84(dVar19,0);
  auVar16._0_8_ = dVar1 * dVar11 + dVar4 * dVar13;
  auVar16._12_4_ = (int)((ulong)dVar19 >> 0x20);
  auVar16 = auVar16 ^ _DAT_0010a060;
  lVar15 = uVar14 * 0xe0;
  *(double *)(this + lVar15 + 0x10) =
       dVar17 * dVar5 + *(double *)(this + uVar14 * 0x18 + 0x4d8) + (dVar2 * dVar8 - dVar18 * dVar4)
       + *(double *)(this + 0x1d0);
  *(double *)(this + lVar15 + 0x10 + 8) =
       dVar18 * dVar5 + dVar9 + (dVar4 * dVar17 - dVar8 * dVar1) + dVar7;
  *(double *)(this + lVar15 + 0x20) =
       dVar8 * dVar5 + dVar3 + (dVar1 * dVar18 - dVar17 * dVar2) + dVar6;
  *(double *)(this + lVar15 + 0x30) = auVar20._0_8_ + dVar2 * dVar12 + dVar5 * dVar10;
  *(double *)(this + lVar15 + 0x30 + 8) = auVar20._8_8_ + dVar2 * dVar13 + dVar5 * dVar11;
  *(double *)(this + lVar15 + 0x40) = auVar16._0_8_ + (dVar5 * dVar12 - dVar2 * dVar10);
  *(double *)(this + lVar15 + 0x40 + 8) = auVar16._8_8_ + (dVar5 * dVar13 - dVar2 * dVar11);
  *(undefined8 *)(this + 0x2b0) = *(undefined8 *)(this + 0x1f0);
  *(undefined8 *)(this + 0x2b8) = *(undefined8 *)(this + 0x1f8);
  *(undefined8 *)(this + 0x2c0) = *(undefined8 *)(this + 0x200);
  *(undefined8 *)(this + 0x2c8) = *(undefined8 *)(this + 0x208);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprint() {
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
  ref_waist_r = ref_waist_pose.q();
}